

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObservation.h
# Opt level: O0

double __thiscall CEObservation::GetAzimuth_Deg(CEObservation *this)

{
  double dVar1;
  CEDate *jd;
  CESkyCoord *in_stack_ffffffffffffff98;
  CEDate *in_stack_ffffffffffffffa0;
  CEDate local_58;
  CEAngle local_18;
  
  CppEphem::julian_date_J2000();
  jd = &local_58;
  CEDate::CEDate(in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98,
                 (CEDateType)((ulong)jd >> 0x20));
  CESkyCoord::XCoord(in_stack_ffffffffffffff98,jd);
  dVar1 = CEAngle::Deg(&local_18);
  CEAngle::~CEAngle((CEAngle *)0x1203e8);
  CEDate::~CEDate((CEDate *)0x1203f2);
  return dVar1;
}

Assistant:

inline
double CEObservation::GetAzimuth_Deg() 
{
    return cached_coords_.XCoord().Deg();
}